

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  cmake *pcVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  char *pcVar7;
  _func_int **pp_Var8;
  size_type *psVar9;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this->GlobalGenerator,lang);
  if (bVar2) {
    std::operator+(&local_228,"CMAKE_",lang);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
    pp_Var8 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var8) {
      local_198[0]._0_8_ = *pp_Var8;
      local_198[0]._8_8_ = plVar3[3];
      local_1a8._0_8_ = local_1a8 + 0x10;
    }
    else {
      local_198[0]._0_8_ = *pp_Var8;
      local_1a8._0_8_ = (_func_int **)*plVar3;
    }
    local_1a8._8_8_ = plVar3[1];
    *plVar3 = (long)pp_Var8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pcVar4 = GetDefinition(this,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      return pcVar4;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar4 = "no";
    if (error == (string *)0x0) {
      pcVar4 = "No";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," known features for ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," compiler\n\"",0xb);
    std::operator+(&local_1c8,"CMAKE_",lang);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_228.field_2._M_allocated_capacity = *psVar9;
      local_228.field_2._8_8_ = plVar3[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar9;
      local_228._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_228._M_string_length = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pcVar4 = GetDefinition(this,&local_228);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "";
    }
    sVar6 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\nversion ",10);
    std::operator+(&local_1e8,"CMAKE_",lang);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_208.field_2._M_allocated_capacity = *psVar9;
      local_208.field_2._8_8_ = plVar3[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar9;
      local_208._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_208._M_string_length = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pcVar7 = GetDefinition(this,&local_208);
    pcVar4 = "";
    if (pcVar7 != (char *)0x0) {
      pcVar4 = pcVar7;
    }
    sVar6 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (error == (string *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_228,&this->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_228);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_002ed37d;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar4 = "cannot";
    if (error == (string *)0x0) {
      pcVar4 = "Cannot";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," use features from non-enabled language ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    if (error == (string *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_228,&this->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_228);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_002ed37d;
  }
  operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
LAB_002ed37d:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return (char *)0x0;
}

Assistant:

const char* cmMakefile::CompileFeaturesAvailable(const std::string& lang,
                                                 std::string* error) const
{
  if (!this->GlobalGenerator->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return CM_NULLPTR;
  }

  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return CM_NULLPTR;
  }
  return featuresKnown;
}